

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calcdb.cc
# Opt level: O1

void __thiscall DbaseCtrlBlk::get_next_trans_ext(DbaseCtrlBlk *this)

{
  ulong uVar1;
  unsigned_long uVar2;
  
  uVar2 = this->cur_blk_size - (long)this->cur_buf_pos;
  if (uVar2 == 0) {
    uVar2 = 0;
  }
  else {
    memcpy(this->buf,this->buf + this->cur_buf_pos,uVar2 * 4);
  }
  this->cur_blk_size = uVar2;
  uVar1 = read(this->fd,this->buf + uVar2,((long)this->buf_size - uVar2) * 4);
  this->cur_blk_size = this->cur_blk_size + uVar1 / 4;
  this->cur_buf_pos = 0;
  return;
}

Assistant:

void DbaseCtrlBlk::get_next_trans_ext() {
    // Need to get more items from file
    auto res = cur_blk_size - cur_buf_pos;
    if (res > 0) {
        // First copy partial transaction to beginning of buffer
        memcpy((void *) buf,
               (void *) (buf + cur_buf_pos),
               res * INT_SIZE);
        cur_blk_size = res;
    } else {
        // No partial transaction in buffer
        cur_blk_size = 0;
    }

    res = read(fd, (void *) (buf + cur_blk_size), ((buf_size - cur_blk_size) * INT_SIZE));

    if (res < 0) {
        throw runtime_error("reading in database");
    }
    cur_blk_size += res / INT_SIZE;
    cur_buf_pos = 0;
}